

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

int ensure_in_buff_size(archive_read_filter *self,uudecode *uudecode,size_t size)

{
  void *__dest;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t newsize;
  uchar *ptr;
  ulong local_30;
  
  if (*(ulong *)(in_RSI + 0x18) < in_RDX) {
    local_30 = *(ulong *)(in_RSI + 0x18);
    do {
      if (local_30 < 0x8000) {
        local_30 = local_30 << 1;
      }
      else {
        local_30 = local_30 + 0x400;
      }
    } while (local_30 < in_RDX);
    __dest = malloc(local_30);
    if (__dest == (void *)0x0) {
      free((void *)0x0);
      archive_set_error(*(archive **)(in_RDI + 0x18),0xc,"Can\'t allocate data for uudecode");
      return -0x1e;
    }
    if (*(int *)(in_RSI + 0x10) != 0) {
      memmove(__dest,*(void **)(in_RSI + 8),(long)*(int *)(in_RSI + 0x10));
    }
    free(*(void **)(in_RSI + 8));
    *(void **)(in_RSI + 8) = __dest;
    *(ulong *)(in_RSI + 0x18) = local_30;
  }
  return 0;
}

Assistant:

static int
ensure_in_buff_size(struct archive_read_filter *self,
    struct uudecode *uudecode, size_t size)
{

	if (size > uudecode->in_allocated) {
		unsigned char *ptr;
		size_t newsize;

		/*
		 * Calculate a new buffer size for in_buff.
		 * Increase its value until it has enough size we need.
		 */
		newsize = uudecode->in_allocated;
		do {
			if (newsize < IN_BUFF_SIZE*32)
				newsize <<= 1;
			else
				newsize += IN_BUFF_SIZE;
		} while (size > newsize);
		/* Allocate the new buffer. */
		ptr = malloc(newsize);
		if (ptr == NULL) {
			free(ptr);
			archive_set_error(&self->archive->archive,
			    ENOMEM,
    			    "Can't allocate data for uudecode");
			return (ARCHIVE_FATAL);
		}
		/* Move the remaining data in in_buff into the new buffer. */
		if (uudecode->in_cnt)
			memmove(ptr, uudecode->in_buff, uudecode->in_cnt);
		/* Replace in_buff with the new buffer. */
		free(uudecode->in_buff);
		uudecode->in_buff = ptr;
		uudecode->in_allocated = newsize;
	}
	return (ARCHIVE_OK);
}